

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::navigateToParent(QFileDialogPrivate *this)

{
  QObject *this_00;
  char cVar1;
  long in_FS_OFFSET;
  QDir dir;
  QArrayData *local_88;
  char16_t *pcStack_80;
  qsizetype local_78;
  QString local_68;
  undefined1 *local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModel::rootDirectory();
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char16_t *)0x0;
  local_68.d.size = 0;
  cVar1 = QDir::isRoot();
  if (cVar1 == '\0') {
    QDir::cdUp();
    QDir::absolutePath();
    local_68.d.d = (Data *)local_48.shared;
    local_68.d.ptr = (char16_t *)local_48._8_8_;
    local_68.d.size = local_48._16_8_;
  }
  else {
    QFileSystemModel::myComputer((int)&local_48);
    ::QVariant::toString();
    local_68.d.d = (Data *)local_88;
    local_68.d.ptr = pcStack_80;
    local_68.d.size = local_78;
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  QFileDialog::setDirectory((QFileDialog *)this_00,&local_68);
  local_48.shared = (PrivateShared *)0x0;
  local_48._8_8_ = &local_68;
  QMetaObject::activate(this_00,&QFileDialog::staticMetaObject,3,&local_48.shared);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  QDir::~QDir((QDir *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::navigateToParent()
{
    Q_Q(QFileDialog);
    QDir dir(model->rootDirectory());
    QString newDirectory;
    if (dir.isRoot()) {
        newDirectory = model->myComputer().toString();
    } else {
        dir.cdUp();
        newDirectory = dir.absolutePath();
    }
    q->setDirectory(newDirectory);
    emit q->directoryEntered(newDirectory);
}